

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::updateBanner(void)

{
  uint uVar1;
  int iVar2;
  string text;
  stringformatter local_130;
  char local_128 [272];
  
  if (updateBanner()::lastshow == '\0') {
    iVar2 = __cxa_guard_acquire(&updateBanner()::lastshow);
    if (iVar2 != 0) {
      updateBanner::lastshow = lastmillis;
      __cxa_guard_release(&updateBanner()::lastshow);
    }
  }
  if ((0 < DAT_00192314) && (bannerintervolmillis <= lastmillis - updateBanner::lastshow)) {
    local_130.buf = local_128;
    uVar1 = randomMT();
    stringformatter::operator()
              (&local_130,"%s",
               *(undefined8 *)
                (banners + ((long)(ulong)(uVar1 & 0xffffff) % (long)DAT_00192314 & 0xffffffffU) * 8)
              );
    sendservmsg(local_128);
    updateBanner::lastshow = lastmillis;
  }
  return;
}

Assistant:

void updateBanner()
    {
        static int lastshow = lastmillis;
        if(banners.length() > 0)
        {
            if((lastmillis-lastshow) >= bannerintervolmillis)
            {
                defformatstring(text)("%s", banners[rnd(banners.length())]);
                sendservmsg(text);
                lastshow = lastmillis;
            } else return;
        }
    }